

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * declarator(dmr_C *C,token *token,decl_state *ctx)

{
  token *ptVar1;
  decl_state *ctx_local;
  token *token_local;
  dmr_C *C_local;
  
  ptVar1 = pointer(C,token,ctx);
  ptVar1 = direct_declarator(C,ptVar1,ctx);
  return ptVar1;
}

Assistant:

static struct token *declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	token = pointer(C, token, ctx);
	return direct_declarator(C, token, ctx);
}